

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O1

REF_STATUS ref_mpi_int_size_type(REF_SIZE size,REF_TYPE *type)

{
  REF_TYPE RVar1;
  
  *type = 0;
  if (size == 4) {
    RVar1 = 1;
  }
  else {
    if (size != 8) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x102,
             "ref_mpi_int_size_type",6,"data size");
      printf("size %lu not %lu %lu\n",size,4,8);
      return 6;
    }
    RVar1 = 2;
  }
  *type = RVar1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_int_size_type(REF_SIZE size, REF_TYPE *type) {
  *type = REF_UNKNOWN_TYPE;
  switch (size) {
    case sizeof(REF_INT):
      *type = REF_INT_TYPE;
      break;
    case sizeof(REF_LONG):
      *type = REF_LONG_TYPE;
      break;
    default:
      RSB(REF_IMPLEMENT, "data size", {
        printf("size %lu not %lu %lu\n", (unsigned long)size,
               (unsigned long)sizeof(REF_INT), (unsigned long)sizeof(REF_LONG));
      });
  }
  return REF_SUCCESS;
}